

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::GenerateImportedFileChecksCode
          (cmExportFileGenerator *this,ostream *os,cmGeneratorTarget *target,
          ImportPropertyMap *properties,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *importedLocations,string *importedXcFrameworkLocation)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  pointer ppVar4;
  string local_f8;
  _Self local_d8;
  _Self local_d0;
  const_iterator pi;
  string *li;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_78;
  undefined1 local_58 [8];
  string targetName;
  string *importedXcFrameworkLocation_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *importedLocations_local;
  ImportPropertyMap *properties_local;
  cmGeneratorTarget *target_local;
  ostream *os_local;
  cmExportFileGenerator *this_local;
  
  targetName.field_2._8_8_ = importedXcFrameworkLocation;
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_78,target);
  cmStrCat<std::__cxx11::string&,std::__cxx11::string>
            ((string *)local_58,&this->Namespace,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  poVar2 = std::operator<<(os,"list(APPEND _cmake_import_check_targets ");
  poVar2 = std::operator<<(poVar2,(string *)local_58);
  std::operator<<(poVar2," )\n");
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    poVar2 = std::operator<<(os,"set(_cmake_import_check_xcframework_for_");
    poVar2 = std::operator<<(poVar2,(string *)local_58);
    poVar2 = std::operator<<(poVar2,' ');
    cmExportFileGeneratorEscape((string *)&__range1,(string *)targetName.field_2._8_8_);
    poVar2 = std::operator<<(poVar2,(string *)&__range1);
    std::operator<<(poVar2,")\n");
    std::__cxx11::string::~string((string *)&__range1);
  }
  poVar2 = std::operator<<(os,"list(APPEND _cmake_import_check_files_for_");
  poVar2 = std::operator<<(poVar2,(string *)local_58);
  std::operator<<(poVar2," ");
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(importedLocations);
  li = (string *)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(importedLocations);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&li), bVar1) {
    pi._M_node = (_Base_ptr)
                 std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end1);
    local_d0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(properties,(key_type *)pi._M_node);
    local_d8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(properties);
    bVar1 = std::operator!=(&local_d0,&local_d8);
    if (bVar1) {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_d0);
      cmExportFileGeneratorEscape(&local_f8,&ppVar4->second);
      poVar2 = std::operator<<(os,(string *)&local_f8);
      std::operator<<(poVar2," ");
      std::__cxx11::string::~string((string *)&local_f8);
    }
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::operator<<(os,")\n\n");
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportedFileChecksCode(
  std::ostream& os, cmGeneratorTarget* target,
  ImportPropertyMap const& properties,
  const std::set<std::string>& importedLocations,
  const std::string& importedXcFrameworkLocation)
{
  // Construct the imported target name.
  std::string targetName = cmStrCat(this->Namespace, target->GetExportName());

  os << "list(APPEND _cmake_import_check_targets " << targetName << " )\n";
  if (!importedXcFrameworkLocation.empty()) {
    os << "set(_cmake_import_check_xcframework_for_" << targetName << ' '
       << cmExportFileGeneratorEscape(importedXcFrameworkLocation) << ")\n";
  }
  os << "list(APPEND _cmake_import_check_files_for_" << targetName << " ";

  for (std::string const& li : importedLocations) {
    auto pi = properties.find(li);
    if (pi != properties.end()) {
      os << cmExportFileGeneratorEscape(pi->second) << " ";
    }
  }

  os << ")\n\n";
}